

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::CmpHelperSTRCASENE(char *s1_expression,char *s2_expression,char *s1,char *s2)

{
  bool bVar1;
  AssertionResult *this;
  AssertionResult *this_00;
  AssertionResult *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  undefined8 in_RDI;
  AssertionResult AVar3;
  char *in_stack_ffffffffffffff58;
  char (*in_stack_ffffffffffffff88) [12];
  AssertionResult *in_stack_ffffffffffffff90;
  AssertionResult *other;
  AssertionResult local_38 [3];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff58,(char *)0x1538a1);
  if (bVar1) {
    other = local_38;
    AssertionFailure();
    this = AssertionResult::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    this_00 = AssertionResult::operator<<
                        (in_stack_ffffffffffffff90,(char **)in_stack_ffffffffffffff88);
    value = AssertionResult::operator<<(this_00,(char (*) [7])in_stack_ffffffffffffff88);
    AssertionResult::operator<<(this_00,(char **)value);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::operator<<(this_00,(char **)value);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::operator<<(this_00,(char **)value);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::AssertionResult(this,other);
    AssertionResult::~AssertionResult((AssertionResult *)0x1539b8);
    sVar2.ptr_ = extraout_RDX;
  }
  else {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperSTRCASENE(const char* s1_expression,
                                   const char* s2_expression,
                                   const char* s1,
                                   const char* s2) {
  if (!String::CaseInsensitiveCStringEquals(s1, s2)) {
    return AssertionSuccess();
  } else {
    return AssertionFailure()
        << "Expected: (" << s1_expression << ") != ("
        << s2_expression << ") (ignoring case), actual: \""
        << s1 << "\" vs \"" << s2 << "\"";
  }
}